

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDarFold(Abc_Ntk_t *pNtk,int fCompl,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  char *pcVar2;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar1 = (Abc_Ntk_t *)0x0;
    pAig = Abc_NtkToDar(pNtk,0,1);
    if (pAig != (Aig_Man_t *)0x0) {
      pMan = Saig_ManDupFoldConstrsFunc(pAig,fCompl,fVerbose);
      Aig_ManStop(pAig);
      pAVar1 = Abc_NtkFromAigPhase(pMan);
      pcVar2 = Extra_UtilStrsav(pMan->pName);
      pAVar1->pName = pcVar2;
      pcVar2 = Extra_UtilStrsav(pMan->pSpec);
      pAVar1->pSpec = pcVar2;
      Aig_ManStop(pMan);
    }
    return pAVar1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x122a,"Abc_Ntk_t *Abc_NtkDarFold(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDarFold( Abc_Ntk_t * pNtk, int fCompl, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pMan = Saig_ManDupFoldConstrsFunc( pTemp = pMan, fCompl, fVerbose );
    Aig_ManStop( pTemp );
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pMan->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}